

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.hpp
# Opt level: O0

SignaturesVector * __thiscall
Diligent::SerializedPipelineStateImpl::GetSignatures(SerializedPipelineStateImpl *this)

{
  PIPELINE_STATE_STATUS PVar1;
  Char *Message;
  char (*in_R8) [68];
  undefined1 local_30 [8];
  string msg;
  SerializedPipelineStateImpl *this_local;
  
  msg.field_2._8_8_ = this;
  PVar1 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  if (PVar1 != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              ((string *)local_30,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",in_R8
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/include/SerializedPipelineStateImpl.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)local_30);
  }
  return &this->m_Signatures;
}

Assistant:

const SignaturesVector& GetSignatures()
    {
        DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
        return m_Signatures;
    }